

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O1

FilterPropagateResult __thiscall
duckdb::CheckZonemapTemplated<short>
          (duckdb *this,BaseStatistics *stats,ExpressionType comparison_type,
          array_ptr<duckdb::Value,_true> constants)

{
  short min_value;
  short max_value;
  FilterPropagateResult FVar1;
  int16_t constant;
  Value *this_00;
  Value *pVVar2;
  undefined7 in_register_00000011;
  array_ptr_iterator<duckdb::Value> __begin2;
  array_ptr_iterator<duckdb::Value> local_50;
  Value *local_38;
  
  local_50.ptr = (Value *)CONCAT71(in_register_00000011,comparison_type);
  pVVar2 = constants.ptr;
  min_value = *(short *)(this + 0x30);
  max_value = *(short *)(this + 0x40);
  local_50.index = 0;
  if (pVVar2 != (Value *)0x0) {
    local_50.size = (idx_t)pVVar2;
    local_38 = local_50.ptr;
    do {
      this_00 = array_ptr_iterator<duckdb::Value>::operator*(&local_50);
      constant = Value::GetValueUnsafe<short>(this_00);
      FVar1 = CheckZonemapTemplated<short>
                        ((BaseStatistics *)this,(ExpressionType)stats,min_value,max_value,constant);
      if (FVar1 < FILTER_ALWAYS_FALSE) {
        return FVar1;
      }
      local_50.index = (idx_t)&((LogicalType *)local_50.index)->physical_type_;
      if (local_50.size <= local_50.index) {
        local_50.index = local_50.size;
      }
    } while (((local_50.ptr != local_38) || ((Value *)local_50.index != pVVar2)) ||
            ((Value *)local_50.size != pVVar2));
  }
  return FILTER_ALWAYS_FALSE;
}

Assistant:

FilterPropagateResult CheckZonemapTemplated(const BaseStatistics &stats, ExpressionType comparison_type,
                                            array_ptr<Value> constants) {
	T min_value = NumericStats::GetMinUnsafe<T>(stats);
	T max_value = NumericStats::GetMaxUnsafe<T>(stats);
	for (auto &constant_value : constants) {
		D_ASSERT(constant_value.type() == stats.GetType());
		D_ASSERT(!constant_value.IsNull());
		T constant = constant_value.GetValueUnsafe<T>();
		auto prune_result = CheckZonemapTemplated(stats, comparison_type, min_value, max_value, constant);
		if (prune_result == FilterPropagateResult::NO_PRUNING_POSSIBLE) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else if (prune_result == FilterPropagateResult::FILTER_ALWAYS_TRUE) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		}
	}
	return FilterPropagateResult::FILTER_ALWAYS_FALSE;
}